

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_replace_item_via_pointer_should_replace_items(void)

{
  cJSON_bool cVar1;
  cJSON *item;
  cJSON *item_00;
  cJSON *item_01;
  cJSON *array;
  long in_FS_OFFSET;
  cJSON replacements [3];
  cJSON local_f8;
  cJSON local_b8;
  cJSON local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  item = cJSON_CreateNull();
  if (item == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x10d);
  }
  item_00 = cJSON_CreateNull();
  if (item_00 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x10f);
  }
  item_01 = cJSON_CreateNull();
  if (item_01 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x111);
  }
  array = cJSON_CreateArray();
  if (array == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x114);
  }
  cJSON_AddItemToArray(array,item);
  cJSON_AddItemToArray(array,item_00);
  cJSON_AddItemToArray(array,item_01);
  memset(&local_f8,0,0xc0);
  cVar1 = cJSON_ReplaceItemViaPointer(array,item,&local_f8);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x11e);
  }
  if (local_f8.prev != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x11f);
  }
  if (local_f8.next != item_00) {
    UnityFail(" Expected TRUE Was FALSE",0x120);
  }
  if (item_00->prev != &local_f8) {
    UnityFail(" Expected TRUE Was FALSE",0x121);
  }
  if (array->child != &local_f8) {
    UnityFail(" Expected TRUE Was FALSE",0x122);
  }
  cVar1 = cJSON_ReplaceItemViaPointer(array,item_00,&local_b8);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x125);
  }
  if (local_b8.prev != &local_f8) {
    UnityFail(" Expected TRUE Was FALSE",0x126);
  }
  if (local_b8.next != item_01) {
    UnityFail(" Expected TRUE Was FALSE",0x127);
  }
  if (item_01->prev != &local_b8) {
    UnityFail(" Expected TRUE Was FALSE",0x128);
  }
  cVar1 = cJSON_ReplaceItemViaPointer(array,item_01,&local_78);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",299);
  }
  if (local_78.prev != &local_b8) {
    UnityFail(" Expected TRUE Was FALSE",300);
  }
  if (local_78.next != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x12d);
  }
  if (local_b8.next != &local_78) {
    UnityFail(" Expected TRUE Was FALSE",0x12e);
  }
  (*global_hooks.deallocate)(array);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_replace_item_via_pointer_should_replace_items(void)
{
    cJSON replacements[3];
    cJSON *beginning = NULL;
    cJSON *middle = NULL;
    cJSON *end = NULL;
    cJSON *array = NULL;

    beginning = cJSON_CreateNull();
    TEST_ASSERT_NOT_NULL(beginning);
    middle = cJSON_CreateNull();
    TEST_ASSERT_NOT_NULL(middle);
    end = cJSON_CreateNull();
    TEST_ASSERT_NOT_NULL(end);

    array = cJSON_CreateArray();
    TEST_ASSERT_NOT_NULL(array);

    cJSON_AddItemToArray(array, beginning);
    cJSON_AddItemToArray(array, middle);
    cJSON_AddItemToArray(array, end);


    memset(replacements, '\0', sizeof(replacements));

    /* replace beginning */
    TEST_ASSERT_TRUE(cJSON_ReplaceItemViaPointer(array, beginning, &(replacements[0])));
    TEST_ASSERT_NULL(replacements[0].prev);
    TEST_ASSERT_TRUE(replacements[0].next == middle);
    TEST_ASSERT_TRUE(middle->prev == &(replacements[0]));
    TEST_ASSERT_TRUE(array->child == &(replacements[0]));

    /* replace middle */
    TEST_ASSERT_TRUE(cJSON_ReplaceItemViaPointer(array, middle, &(replacements[1])));
    TEST_ASSERT_TRUE(replacements[1].prev == &(replacements[0]));
    TEST_ASSERT_TRUE(replacements[1].next == end);
    TEST_ASSERT_TRUE(end->prev == &(replacements[1]));

    /* replace end */
    TEST_ASSERT_TRUE(cJSON_ReplaceItemViaPointer(array, end, &(replacements[2])));
    TEST_ASSERT_TRUE(replacements[2].prev == &(replacements[1]));
    TEST_ASSERT_NULL(replacements[2].next);
    TEST_ASSERT_TRUE(replacements[1].next == &(replacements[2]));

    cJSON_free(array);
}